

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O2

void __thiscall DPlayerMenu::UpdateSkins(DPlayerMenu *this)

{
  TArray<int,_int> *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  FListMenuItem *pFVar4;
  uint uVar5;
  int local_3c;
  FName local_38;
  FName local_34;
  
  local_34.Index = 0x1ea;
  pFVar4 = DListMenu::GetItem(&this->super_DListMenu,&local_34);
  if (pFVar4 != (FListMenuItem *)0x0) {
    if ((((this->PlayerClass->Type->super_PClassActor).super_PClass.Defaults[0x198] & 0x20) == 0) &&
       (iVar2 = userinfo_t::GetPlayerClassNum
                          ((userinfo_t *)(&DAT_009ba458 + (long)consoleplayer * 0x2a0)), iVar2 != -1
       )) {
      this_00 = &this->PlayerSkins;
      TArray<int,_int>::Clear(this_00);
      uVar5 = 0;
      for (local_3c = 0; local_3c < (int)numskins; local_3c = local_3c + 1) {
        bVar1 = FPlayerClass::CheckSkin(this->PlayerClass,local_3c);
        if (bVar1) {
          uVar3 = TArray<int,_int>::Push(this_00,&local_3c);
          (*pFVar4->_vptr_FListMenuItem[8])(pFVar4,(ulong)uVar3,skins + local_3c);
          iVar2 = userinfo_t::GetSkin((userinfo_t *)(&DAT_009ba458 + (long)consoleplayer * 0x2a0));
          if (iVar2 == local_3c) {
            uVar5 = uVar3;
          }
        }
      }
      (*pFVar4->_vptr_FListMenuItem[10])(pFVar4,0,(ulong)uVar5);
      uVar5 = this_00->Array[(int)uVar5];
    }
    else {
      uVar5 = 0;
      (*pFVar4->_vptr_FListMenuItem[8])(pFVar4,0,"Base");
      (*pFVar4->_vptr_FListMenuItem[10])(pFVar4,0,0);
    }
    local_38.Index = 0x1ee;
    pFVar4 = DListMenu::GetItem(&this->super_DListMenu,&local_38);
    if (pFVar4 != (FListMenuItem *)0x0) {
      (*pFVar4->_vptr_FListMenuItem[10])(pFVar4,0x10002,(ulong)uVar5);
    }
  }
  UpdateTranslation(this);
  return;
}

Assistant:

void DPlayerMenu::UpdateSkins()
{
	int sel = 0;
	int skin;
	FListMenuItem *li = GetItem(NAME_Skin);
	if (li != NULL)
	{
		if (GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN ||
			players[consoleplayer].userinfo.GetPlayerClassNum() == -1)
		{
			li->SetString(0, "Base");
			li->SetValue(0, 0);
			skin = 0;
		}
		else
		{
			PlayerSkins.Clear();
			for(int i=0;i<(int)numskins; i++)
			{
				if (PlayerClass->CheckSkin(i))
				{
					int j = PlayerSkins.Push(i);
					li->SetString(j, skins[i].name);
					if (players[consoleplayer].userinfo.GetSkin() == i)
					{
						sel = j;
					}
				}
			}
			li->SetValue(0, sel);
			skin = PlayerSkins[sel];
		}
		li = GetItem(NAME_Playerdisplay);
		if (li != NULL)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, skin);
		}
	}
	UpdateTranslation();
}